

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32i386.c
# Opt level: O0

void aros_setlnksym(GlobalVars *gv,Symbol *xdef)

{
  LinkedSection *pLVar1;
  long in_RSI;
  GlobalVars *in_RDI;
  LinkedSection *ls;
  
  if (((*(byte *)(in_RSI + 0x41) & 1) == 0) || ((*(uint *)(in_RSI + 0x48) & 0x80000000) == 0)) {
    elf_setlnksym((GlobalVars *)ls,(Symbol *)in_RDI);
  }
  else {
    if ((*(uint *)(in_RSI + 0x48) & 0x7fffffff) == 0) {
      pLVar1 = smalldata_section(in_RDI);
      *(node **)(in_RSI + 0x38) = (pLVar1->sections).first;
    }
    *(byte *)(in_RSI + 0x41) = *(byte *)(in_RSI + 0x41) & 0xfe;
  }
  return;
}

Assistant:

static void aros_setlnksym(struct GlobalVars *gv,struct Symbol *xdef)
{
  if ((xdef->flags & SYMF_LNKSYM) && (xdef->extra & SYMX_SPECIAL)) {
    struct LinkedSection *ls;

    switch (xdef->extra & ~SYMX_SPECIAL) {
      case LINKERDB:
        ls = smalldata_section(gv);
        xdef->relsect = (struct Section *)ls->sections.first;
        break;
    }
    xdef->flags &= ~SYMF_LNKSYM;  /* do not init again */
  }
  else
    elf_setlnksym(gv,xdef);
}